

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O1

void __thiscall
duckdb::LocalSortState::Initialize
          (LocalSortState *this,GlobalSortState *global_sort_state,BufferManager *buffer_manager_p)

{
  BufferManager *pBVar1;
  SortLayout *pSVar2;
  ulong uVar3;
  idx_t iVar4;
  int iVar5;
  undefined4 extraout_var;
  RowDataCollection *pRVar6;
  idx_t block_capacity;
  
  this->sort_layout = &global_sort_state->sort_layout;
  this->payload_layout = &global_sort_state->payload_layout;
  this->buffer_manager = buffer_manager_p;
  iVar5 = (*buffer_manager_p->_vptr_BufferManager[0xf])(buffer_manager_p);
  block_capacity = CONCAT44(extraout_var,iVar5);
  pBVar1 = this->buffer_manager;
  pSVar2 = this->sort_layout;
  uVar3 = pSVar2->entry_size;
  pRVar6 = (RowDataCollection *)operator_new(0x80);
  RowDataCollection::RowDataCollection
            (pRVar6,pBVar1,block_capacity / uVar3,pSVar2->entry_size,false);
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->radix_sorting_data,pRVar6);
  if (this->sort_layout->all_constant == false) {
    iVar4 = (this->sort_layout->blob_layout).row_width;
    pBVar1 = this->buffer_manager;
    pRVar6 = (RowDataCollection *)operator_new(0x80);
    RowDataCollection::RowDataCollection(pRVar6,pBVar1,block_capacity / iVar4,iVar4,false);
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->blob_sorting_data,pRVar6);
    pBVar1 = this->buffer_manager;
    pRVar6 = (RowDataCollection *)operator_new(0x80);
    RowDataCollection::RowDataCollection(pRVar6,pBVar1,block_capacity,1,true);
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->blob_sorting_heap,pRVar6);
  }
  pBVar1 = this->buffer_manager;
  iVar4 = this->payload_layout->row_width;
  pRVar6 = (RowDataCollection *)operator_new(0x80);
  RowDataCollection::RowDataCollection(pRVar6,pBVar1,block_capacity / iVar4,iVar4,false);
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->payload_data,pRVar6);
  pBVar1 = this->buffer_manager;
  pRVar6 = (RowDataCollection *)operator_new(0x80);
  RowDataCollection::RowDataCollection(pRVar6,pBVar1,block_capacity,1,true);
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->payload_heap,pRVar6);
  this->initialized = true;
  return;
}

Assistant:

void LocalSortState::Initialize(GlobalSortState &global_sort_state, BufferManager &buffer_manager_p) {
	sort_layout = &global_sort_state.sort_layout;
	payload_layout = &global_sort_state.payload_layout;
	buffer_manager = &buffer_manager_p;
	const auto block_size = buffer_manager->GetBlockSize();

	// Radix sorting data
	auto entries_per_block = RowDataCollection::EntriesPerBlock(sort_layout->entry_size, block_size);
	radix_sorting_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, sort_layout->entry_size);

	// Blob sorting data
	if (!sort_layout->all_constant) {
		auto blob_row_width = sort_layout->blob_layout.GetRowWidth();
		entries_per_block = RowDataCollection::EntriesPerBlock(blob_row_width, block_size);
		blob_sorting_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, blob_row_width);
		blob_sorting_heap = make_uniq<RowDataCollection>(*buffer_manager, block_size, 1U, true);
	}

	// Payload data
	auto payload_row_width = payload_layout->GetRowWidth();
	entries_per_block = RowDataCollection::EntriesPerBlock(payload_row_width, block_size);
	payload_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, payload_row_width);
	payload_heap = make_uniq<RowDataCollection>(*buffer_manager, block_size, 1U, true);
	initialized = true;
}